

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

ValidateXrFlagsResult ValidateXrPassthroughStateChangedFlagsFB(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = (value < 0x10) + VALIDATE_XR_FLAGS_INVALID;
  if (value == 0) {
    VVar1 = VALIDATE_XR_FLAGS_ZERO;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrPassthroughStateChangedFlagsFB(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_PASSTHROUGH_STATE_CHANGED_REINIT_REQUIRED_BIT_FB) != 0) {
        // Clear the value XR_PASSTHROUGH_STATE_CHANGED_REINIT_REQUIRED_BIT_FB since it is valid
        int_value &= ~XR_PASSTHROUGH_STATE_CHANGED_REINIT_REQUIRED_BIT_FB;
    }
    if ((int_value & XR_PASSTHROUGH_STATE_CHANGED_NON_RECOVERABLE_ERROR_BIT_FB) != 0) {
        // Clear the value XR_PASSTHROUGH_STATE_CHANGED_NON_RECOVERABLE_ERROR_BIT_FB since it is valid
        int_value &= ~XR_PASSTHROUGH_STATE_CHANGED_NON_RECOVERABLE_ERROR_BIT_FB;
    }
    if ((int_value & XR_PASSTHROUGH_STATE_CHANGED_RECOVERABLE_ERROR_BIT_FB) != 0) {
        // Clear the value XR_PASSTHROUGH_STATE_CHANGED_RECOVERABLE_ERROR_BIT_FB since it is valid
        int_value &= ~XR_PASSTHROUGH_STATE_CHANGED_RECOVERABLE_ERROR_BIT_FB;
    }
    if ((int_value & XR_PASSTHROUGH_STATE_CHANGED_RESTORED_ERROR_BIT_FB) != 0) {
        // Clear the value XR_PASSTHROUGH_STATE_CHANGED_RESTORED_ERROR_BIT_FB since it is valid
        int_value &= ~XR_PASSTHROUGH_STATE_CHANGED_RESTORED_ERROR_BIT_FB;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}